

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_binding.hpp
# Opt level: O3

any * __thiscall
shadow::constructor_detail::generic_constructor_bind_point<long_double,long_double>
          (any *__return_storage_ptr__,constructor_detail *this,any *argument_array)

{
  unkbyte10 Var1;
  holder_base *phVar2;
  constructor_detail *pcVar3;
  any *out;
  
  pcVar3 = this + 0x20;
  if (*this != (constructor_detail)0x0) {
    pcVar3 = (constructor_detail *)(*(long *)(this + 0x10) + 0x10);
  }
  Var1 = *(unkbyte10 *)pcVar3;
  __return_storage_ptr__->on_heap_ = true;
  phVar2 = (holder_base *)operator_new(0x20);
  phVar2->_vptr_holder_base = (_func_int **)&PTR_copy_0012ebc8;
  *(unkbyte10 *)(phVar2 + 2) = Var1;
  (__return_storage_ptr__->field_1).heap = phVar2;
  return __return_storage_ptr__;
}

Assistant:

any
generic_constructor_bind_point(any* argument_array)
{
    typedef std::index_sequence_for<ParamTypes...> param_sequence;

    return braced_init_selector<T, ParamTypes...>::constructor_dispatch(
        argument_array, param_sequence());
}